

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testoffset.cpp
# Opt level: O1

int main(void)

{
  Am_Slot_Key AVar1;
  ushort uVar2;
  Am_Object *pAVar3;
  undefined8 uVar4;
  Am_Wrapper *pAVar5;
  Am_Constraint *pAVar6;
  undefined8 uVar7;
  Am_Object sample;
  Am_Object local_150 [8];
  Am_Object local_148 [8];
  Am_Object local_140 [8];
  Am_Object local_138 [8];
  Am_Object local_130 [8];
  Am_Object local_128 [8];
  Am_Object local_120 [8];
  Am_Object local_118 [8];
  Am_Object local_110 [8];
  Am_Object local_108 [8];
  Am_Object local_100 [8];
  Am_Object local_f8 [8];
  Am_Object local_f0 [8];
  Am_Object local_e8 [8];
  Am_Object local_e0 [8];
  Am_Object local_d8 [8];
  Am_Object local_d0 [8];
  Am_Object local_c8 [16];
  Am_Formula local_b8 [16];
  Am_Formula local_a8 [16];
  Am_Formula local_98 [16];
  Am_Formula local_88 [16];
  Am_Formula local_78 [16];
  Am_Formula local_68 [16];
  Am_Formula local_58 [16];
  Am_Formula local_48 [16];
  Am_Formula local_38 [16];
  Am_Formula local_28 [16];
  
  Am_Initialize();
  Am_Object::Create((char *)local_c8);
  uVar2 = Am_Object::Set((ushort)local_c8,100,0x96);
  pAVar3 = (Am_Object *)Am_Object::Set(uVar2,0x65,200);
  Am_Object::Am_Object(local_150,pAVar3);
  Am_Object::~Am_Object(local_c8);
  Am_Object::Create((char *)local_d8);
  uVar2 = Am_Object::Set((ushort)local_d8,0x66,300);
  uVar4 = Am_Object::Set(uVar2,0x67,400);
  AVar1 = KEY0;
  Am_Object::Create((char *)local_e8);
  pAVar5 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Red);
  uVar2 = Am_Object::Set((ushort)local_e8,(Am_Wrapper *)0x6a,(ulong)pAVar5);
  uVar2 = Am_Object::Set(uVar2,100,10);
  uVar2 = Am_Object::Set(uVar2,0x65,10);
  Am_From_Owner((ushort)local_c8,0x66,1.0);
  pAVar6 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)local_c8);
  uVar2 = Am_Object::Set(uVar2,(Am_Constraint *)0x66,(ulong)pAVar6);
  Am_From_Owner((ushort)local_28,0x67,1.0);
  pAVar6 = Am_Formula::operator_cast_to_Am_Constraint_(local_28);
  pAVar3 = (Am_Object *)Am_Object::Set(uVar2,(Am_Constraint *)0x67,(ulong)pAVar6);
  Am_Object::Am_Object(local_e0,pAVar3);
  uVar4 = Am_Object::Add_Part(uVar4,AVar1,local_e0,0);
  Am_Object::Create((char *)local_f8);
  pAVar5 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Blue);
  uVar2 = Am_Object::Set((ushort)local_f8,(Am_Wrapper *)0x6a,(ulong)pAVar5);
  uVar2 = Am_Object::Set(uVar2,100,0xf);
  uVar2 = Am_Object::Set(uVar2,0x65,0xf);
  Am_From_Sibling((ushort)local_38,KEY0,0x66,0.5);
  pAVar6 = Am_Formula::operator_cast_to_Am_Constraint_(local_38);
  uVar2 = Am_Object::Set(uVar2,(Am_Constraint *)0x66,(ulong)pAVar6);
  Am_Same_As((ushort)local_48,0x66,1.0);
  pAVar6 = Am_Formula::operator_cast_to_Am_Constraint_(local_48);
  pAVar3 = (Am_Object *)Am_Object::Set(uVar2,(Am_Constraint *)0x67,(ulong)pAVar6);
  Am_Object::Am_Object(local_f0,pAVar3);
  uVar4 = Am_Object::Add_Part(uVar4,local_f0,1,0);
  Am_Object::Create((char *)local_108);
  Am_From_Owner((ushort)local_58,0x67,0.5);
  pAVar6 = Am_Formula::operator_cast_to_Am_Constraint_(local_58);
  uVar2 = Am_Object::Set((ushort)local_108,(Am_Constraint *)0x65,(ulong)pAVar6);
  uVar2 = Am_Object::Set(uVar2,100,0x14);
  Am_From_Part((ushort)local_68,KEY0,0x66,1.0);
  pAVar6 = Am_Formula::operator_cast_to_Am_Constraint_(local_68);
  uVar2 = Am_Object::Set(uVar2,(Am_Constraint *)0x66,(ulong)pAVar6);
  Am_From_Part((ushort)local_78,KEY0,0x67,1.0);
  pAVar6 = Am_Formula::operator_cast_to_Am_Constraint_(local_78);
  uVar7 = Am_Object::Set(uVar2,(Am_Constraint *)0x67,(ulong)pAVar6);
  Am_Object::Create((char *)local_118);
  pAVar5 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Green);
  uVar2 = Am_Object::Set((ushort)local_118,(Am_Wrapper *)0x6a,(ulong)pAVar5);
  uVar2 = Am_Object::Set(uVar2,0x66,0x32);
  pAVar3 = (Am_Object *)Am_Object::Set(uVar2,0x67,100);
  Am_Object::Am_Object(local_110,pAVar3);
  uVar7 = Am_Object::Add_Part(uVar7,local_110,1,0);
  AVar1 = KEY0;
  Am_Object::Create((char *)local_128);
  pAVar5 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Orange);
  uVar2 = Am_Object::Set((ushort)local_128,(Am_Wrapper *)0x6a,(ulong)pAVar5);
  uVar2 = Am_Object::Set(uVar2,100,10);
  uVar2 = Am_Object::Set(uVar2,0x65,10);
  uVar2 = Am_Object::Set(uVar2,0x66,0x1e);
  pAVar3 = (Am_Object *)Am_Object::Set(uVar2,0x67,0x50);
  Am_Object::Am_Object(local_120,pAVar3);
  pAVar3 = (Am_Object *)Am_Object::Add_Part(uVar7,AVar1,local_120);
  Am_Object::Am_Object(local_100,pAVar3);
  uVar4 = Am_Object::Add_Part(uVar4,local_100,1,0);
  Am_Object::Create((char *)local_138);
  pAVar5 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Blue);
  uVar2 = Am_Object::Set((ushort)local_138,(Am_Wrapper *)0x6a,(ulong)pAVar5);
  Am_Object::Am_Object(local_140,local_150);
  Am_From_Object(local_88,local_140,100);
  pAVar6 = Am_Formula::operator_cast_to_Am_Constraint_(local_88);
  uVar2 = Am_Object::Set(uVar2,(Am_Constraint *)0x64,(ulong)pAVar6);
  Am_Object::Am_Object(local_148,local_150);
  Am_From_Object(0x3f800000,local_98,local_148,0x65);
  pAVar6 = Am_Formula::operator_cast_to_Am_Constraint_(local_98);
  uVar2 = Am_Object::Set(uVar2,(Am_Constraint *)0x65,(ulong)pAVar6);
  Am_From_Sibling((ushort)local_a8,KEY0,0x66,0.5);
  pAVar6 = Am_Formula::operator_cast_to_Am_Constraint_(local_a8);
  uVar2 = Am_Object::Set(uVar2,(Am_Constraint *)0x66,(ulong)pAVar6);
  Am_Same_As((ushort)local_b8,0x66,1.0);
  pAVar6 = Am_Formula::operator_cast_to_Am_Constraint_(local_b8);
  pAVar3 = (Am_Object *)Am_Object::Set(uVar2,(Am_Constraint *)0x67,(ulong)pAVar6);
  Am_Object::Am_Object(local_130,pAVar3);
  pAVar3 = (Am_Object *)Am_Object::Add_Part(uVar4,local_130,1,0);
  Am_Object::Am_Object(local_d0,pAVar3);
  Am_Object::Add_Part(&Am_Screen,local_d0,1,0);
  Am_Object::~Am_Object(local_d0);
  Am_Object::~Am_Object(local_130);
  Am_Formula::~Am_Formula(local_b8);
  Am_Formula::~Am_Formula(local_a8);
  Am_Formula::~Am_Formula(local_98);
  Am_Object::~Am_Object(local_148);
  Am_Formula::~Am_Formula(local_88);
  Am_Object::~Am_Object(local_140);
  Am_Object::~Am_Object(local_138);
  Am_Object::~Am_Object(local_100);
  Am_Object::~Am_Object(local_120);
  Am_Object::~Am_Object(local_128);
  Am_Object::~Am_Object(local_110);
  Am_Object::~Am_Object(local_118);
  Am_Formula::~Am_Formula(local_78);
  Am_Formula::~Am_Formula(local_68);
  Am_Formula::~Am_Formula(local_58);
  Am_Object::~Am_Object(local_108);
  Am_Object::~Am_Object(local_f0);
  Am_Formula::~Am_Formula(local_48);
  Am_Formula::~Am_Formula(local_38);
  Am_Object::~Am_Object(local_f8);
  Am_Object::~Am_Object(local_e0);
  Am_Formula::~Am_Formula(local_28);
  Am_Formula::~Am_Formula((Am_Formula *)local_c8);
  Am_Object::~Am_Object(local_e8);
  Am_Object::~Am_Object(local_d8);
  Am_Main_Event_Loop();
  Am_Cleanup();
  Am_Object::~Am_Object(local_150);
  return 0;
}

Assistant:

int
main()
{
  Am_Initialize();

  Am_Object sample = Am_Rectangle.Create().Set(Am_LEFT, 150).Set(Am_TOP, 200);

  Am_Screen.Add_Part(
      Am_Window.Create()
          .Set(Am_WIDTH, 300)
          .Set(Am_HEIGHT, 400)
          .Add_Part(KEY0, Am_Rectangle.Create()
                              .Set(Am_FILL_STYLE, Am_Red)
                              .Set(Am_LEFT, 10)
                              .Set(Am_TOP, 10)
                              .Set(Am_WIDTH, Am_From_Owner(Am_WIDTH, -20))
                              .Set(Am_HEIGHT, Am_From_Owner(Am_HEIGHT, -20)))
          .Add_Part(Am_Rectangle.Create()
                        .Set(Am_FILL_STYLE, Am_Blue)
                        .Set(Am_LEFT, 15)
                        .Set(Am_TOP, 15)
                        .Set(Am_WIDTH, Am_From_Sibling(KEY0, Am_WIDTH, 0, 0.5))
                        .Set(Am_HEIGHT, Am_Same_As(Am_WIDTH, -20)))
          .Add_Part(Am_Group.Create()
                        .Set(Am_TOP, Am_From_Owner(Am_HEIGHT, 0, 0.5))
                        .Set(Am_LEFT, 20)
                        .Set(Am_WIDTH, Am_From_Part(KEY0, Am_WIDTH, 20))
                        .Set(Am_HEIGHT, Am_From_Part(KEY0, Am_HEIGHT, 20))
                        .Add_Part(Am_Rectangle.Create()
                                      .Set(Am_FILL_STYLE, Am_Green)
                                      .Set(Am_WIDTH, 50)
                                      .Set(Am_HEIGHT, 100))
                        .Add_Part(KEY0, Am_Rectangle.Create()
                                            .Set(Am_FILL_STYLE, Am_Orange)
                                            .Set(Am_LEFT, 10)
                                            .Set(Am_TOP, 10)
                                            .Set(Am_WIDTH, 30)
                                            .Set(Am_HEIGHT, 80)))
          .Add_Part(Am_Rectangle.Create()
                        .Set(Am_FILL_STYLE, Am_Blue)
                        .Set(Am_LEFT, Am_From_Object(sample, Am_LEFT))
                        .Set(Am_TOP, Am_From_Object(sample, Am_TOP, 15))
                        .Set(Am_WIDTH, Am_From_Sibling(KEY0, Am_WIDTH, 0, 0.5))
                        .Set(Am_HEIGHT, Am_Same_As(Am_WIDTH, -20))));

  /*  
    extern Am_Formula Am_Same_As (Am_Slot_Key key);
    extern Am_Formula Am_From_Owner (Am_Slot_Key key);
    extern Am_Formula Am_From_Part (Am_Slot_Key part, Am_Slot_Key key);
    extern Am_Formula Am_From_Sibling (Am_Slot_Key sibling, Am_Slot_Key key);
    extern Am_Formula Am_From_Object (Am_Object object, Am_Slot_Key key);

    extern Am_Formula Am_Same_As (Am_Slot_Key key, int offset,
                                  float multiplier = 1.0);
    extern Am_Formula Am_From_Owner (Am_Slot_Key key, int offset,
                                     float multiplier = 1.0);
    extern Am_Formula Am_From_Part (Am_Slot_Key part, Am_Slot_Key key,
			            int offset, float multiplier = 1.0);
    extern Am_Formula Am_From_Sibling (Am_Slot_Key sibling, Am_Slot_Key key,
				       int offset, float multiplier = 1.0);
    extern Am_Formula Am_From_Object (Am_Object object, Am_Slot_Key key,
				      int offset, float multiplier = 1.0);
  */

  Am_Main_Event_Loop();

  Am_Cleanup();
}